

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_error.hpp
# Opt level: O2

void __thiscall jsoncons::jsonpath::jsonpath_error::what(jsonpath_error *this)

{
  what((jsonpath_error *)(&this->super_system_error + *(long *)(*(long *)this + -0x20)));
  return;
}

Assistant:

const char* what() const noexcept override
        {
            if (what_.empty())
            {
                JSONCONS_TRY
                {
                    what_.append(std::system_error::what());
                    if (line_number_ != 0 && column_number_ != 0)
                    {
                        what_.append(" at line ");
                        what_.append(std::to_string(line_number_));
                        what_.append(" and column ");
                        what_.append(std::to_string(column_number_));
                    }
                    else if (column_number_ != 0)
                    {
                        what_.append(" at position ");
                        what_.append(std::to_string(column_number_));
                    }
                    return what_.c_str();
                }
                JSONCONS_CATCH(...)
                {
                    return std::system_error::what();
                }
            }